

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lj_cparse.c
# Opt level: O0

CTSize cp_decl_sizeattr(CPState *cp)

{
  CTSize CVar1;
  long in_RDI;
  uint32_t oldtmask;
  CTSize sz;
  CPToken in_stack_ffffffffffffffec;
  undefined4 uVar2;
  undefined4 in_stack_fffffffffffffff4;
  
  uVar2 = *(undefined4 *)(in_RDI + 0x60);
  *(undefined4 *)(in_RDI + 0x60) = 0x38c0;
  cp_check((CPState *)CONCAT44(in_stack_fffffffffffffff4,uVar2),in_stack_ffffffffffffffec);
  CVar1 = cp_expr_ksize((CPState *)CONCAT44(in_stack_fffffffffffffff4,uVar2));
  *(undefined4 *)(in_RDI + 0x60) = uVar2;
  cp_check((CPState *)CONCAT44(CVar1,uVar2),in_stack_ffffffffffffffec);
  return CVar1;
}

Assistant:

static CTSize cp_decl_sizeattr(CPState *cp)
{
  CTSize sz;
  uint32_t oldtmask = cp->tmask;
  cp->tmask = CPNS_DEFAULT;  /* Required for expression evaluator. */
  cp_check(cp, '(');
  sz = cp_expr_ksize(cp);
  cp->tmask = oldtmask;
  cp_check(cp, ')');
  return sz;
}